

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeSetStabilityFn(void *arkode_mem,ARKExpStabFn EStab,void *estab_data)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem local_28;
  ARKodeHAdaptMem local_20;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"ARKodeSetStabilityFn",&local_28,&local_20);
  if (iVar1 == 0) {
    if (local_28->step_supports_adaptive == 0) {
      iVar1 = -0x30;
      arkProcessError(local_28,-0x30,0x7fe,"ARKodeSetStabilityFn",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
    }
    else {
      local_20->expstab = EStab;
      local_20->estab_data = estab_data;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKodeSetStabilityFn(void* arkode_mem, ARKExpStabFn EStab, void* estab_data)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* NULL argument sets default, otherwise set inputs */
  hadapt_mem->expstab    = EStab;
  hadapt_mem->estab_data = estab_data;

  return (ARK_SUCCESS);
}